

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O3

void MapOptHandler_defaultenvironment(FMapInfoParser *parse,level_info_t *info)

{
  bool bVar1;
  ReverbContainer *pRVar2;
  uint uVar3;
  
  if (parse->format_type == 2) {
    FScanner::MustGetStringName(&parse->sc,"=");
  }
  bVar1 = FScanner::CheckNumber(&parse->sc);
  if (bVar1) {
    uVar3 = (parse->sc).Number << 8;
    bVar1 = FMapInfoParser::CheckNumber(parse);
    if (bVar1) {
      uVar3 = uVar3 | (parse->sc).Number;
    }
  }
  else {
    FScanner::MustGetString(&parse->sc);
    pRVar2 = S_FindEnvironment((parse->sc).String);
    if (pRVar2 == (ReverbContainer *)0x0) {
      uVar3 = 0;
      FScanner::ScriptMessage(&parse->sc,"Unknown sound environment \'%s\'\n",(parse->sc).String);
    }
    else {
      uVar3 = (uint)pRVar2->ID;
    }
  }
  info->DefaultEnvironment = uVar3;
  return;
}

Assistant:

DEFINE_MAP_OPTION(defaultenvironment, false)
{
	int id;

	parse.ParseAssign();
	if (parse.sc.CheckNumber())
	{ // Numeric ID XXX [, YYY]
		id = parse.sc.Number << 8;
		if (parse.CheckNumber())
		{
			id |= parse.sc.Number;
		}
	}
	else
	{ // Named environment
		parse.sc.MustGetString();
		ReverbContainer *reverb = S_FindEnvironment(parse.sc.String);
		if (reverb == NULL)
		{
			parse.sc.ScriptMessage("Unknown sound environment '%s'\n", parse.sc.String);
			id = 0;
		}
		else
		{
			id = reverb->ID;
		}
	}
	info->DefaultEnvironment = id;
}